

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::SetNestedFunc
          (ParseableFunctionInfo *this,FunctionInfo *nestedFunc,uint index,uint32 flags)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfoArray pTVar5;
  
  pNVar1 = (this->nestedArray).ptr;
  if ((pNVar1 == (NestedArray *)0x0) || (pNVar1->nestedCount <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7e2,"(index < this->GetNestedCount())",
                                "Trying to write past the nested func array");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pTVar5 = GetNestedFuncArray(this);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet(pTVar5 + index,nestedFunc);
  return;
}

Assistant:

void ParseableFunctionInfo::SetNestedFunc(FunctionInfo* nestedFunc, uint index, uint32 flags)
    {
        AssertMsg(index < this->GetNestedCount(), "Trying to write past the nested func array");

        FunctionInfoArray nested = this->GetNestedFuncArray();
        nested[index] = nestedFunc;
    }